

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_projection.hpp
# Opt level: O2

Matrix4<float> *
eos::render::perspective<float>
          (Matrix4<float> *__return_storage_ptr__,float fov_y,float aspect,float z_near,float z_far)

{
  float fVar1;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_18 [8];
  
  fVar1 = tanf(fov_y * 0.5);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,local_18);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = 1.0 / (aspect * fVar1);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = 1.0 / fVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = -(z_near + z_far) / (z_far - z_near);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xb] = -1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = (z_far * -2.0 * z_near) / (z_far - z_near);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4<T> perspective(T fov_y, T aspect, T z_near, T z_far)
{
    // Will this assert work? std::abs probably won't work on T?
    // assert(abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0));

    // Note: We want to use std::tan() for floating point types, and for users not using Ceres. However when
    // using the function with Ceres's auto-diff, we need to use ceres::tan(). We might need an extra "using
    // ceres::tan" here.
    using std::tan;
    const T tan_half_fov_y = tan(fov_y / static_cast<T>(2));

    Eigen::Matrix4<T> result = Eigen::Matrix4<T>::Zero(); // Note: Zero() is correct.
    result(0, 0) = static_cast<T>(1) / (aspect * tan_half_fov_y);
    result(1, 1) = static_cast<T>(1) / (tan_half_fov_y);
    result(2, 2) = -(z_far + z_near) / (z_far - z_near);
    result(3, 2) = -static_cast<T>(1);
    result(2, 3) = -(static_cast<T>(2) * z_far * z_near) / (z_far - z_near);
    return result;
}